

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Fl_Input.cxx
# Opt level: O2

int __thiscall Fl_Input::kf_move_word_left(Fl_Input *this)

{
  int p;
  
  p = Fl_Input_::word_start(&this->super_Fl_Input_,(this->super_Fl_Input_).position_);
  shift_position(this,p);
  return 1;
}

Assistant:

int Fl_Input::kf_move_word_left() {
  shift_position(word_start(position()));
  return 1; 
}